

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O0

void __thiscall tcu::TestNode::~TestNode(TestNode *this)

{
  TestNode *this_local;
  
  this->_vptr_TestNode = (_func_int **)&PTR__TestNode_0067b7f0;
  deinit(this);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector(&this->m_children);
  std::__cxx11::string::~string((string *)&this->m_description);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

TestNode::~TestNode (void)
{
	TestNode::deinit();
}